

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg6.c
# Opt level: O0

wchar_t borg_attack_aux_rod_bolt_unknown(wchar_t dam,wchar_t typ)

{
  uint32_t uVar1;
  char *pcVar2;
  wchar_t local_1c;
  wchar_t b_n;
  wchar_t b_i;
  wchar_t i;
  wchar_t typ_local;
  wchar_t dam_local;
  
  local_1c = L'\xffffffff';
  if (((borg_skill[0x65] == 0) && (borg_skill[0x67] == 0)) && (borg_skill[0x6d] == 0)) {
    if ((borg_simulate) && (uVar1 = Rand_div(100), (int)uVar1 < 5)) {
      typ_local = L'\0';
    }
    else {
      for (b_n = L'\0'; b_n < (int)(uint)z_info->pack_size; b_n = b_n + L'\x01') {
        if (((borg_items[b_n].tval == '\x18') && (borg_items[b_n].kind == 0)) &&
           ((borg_items[b_n].pval != 0 &&
            (pcVar2 = strstr(borg_items[b_n].desc,"tried"), pcVar2 == (char *)0x0)))) {
          local_1c = b_n;
        }
      }
      if (local_1c < L'\0') {
        typ_local = L'\0';
      }
      else {
        typ_local = borg_launch_bolt(L'\0',dam,typ,(uint)z_info->max_range,L'\0');
        if ((borg_simulate & 1U) == 0) {
          pcVar2 = format("# Aiming unknown rod \'%s.\'",borg_items + local_1c);
          borg_note(pcVar2);
          borg_zap_slot = local_1c;
          borg_keypress(0x7a);
          borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[local_1c]);
          borg_keypress(0x35);
          successful_target = L'\xffffffff';
        }
      }
    }
  }
  else {
    typ_local = L'\0';
  }
  return typ_local;
}

Assistant:

static int borg_attack_aux_rod_bolt_unknown(int dam, int typ)
{
    int i;
    int b_i = -1;
    int b_n;

    /* No firing while blind, confused, or hallucinating */
    if (borg_skill[BI_ISBLIND] || borg_skill[BI_ISCONFUSED]
        || borg_skill[BI_ISIMAGE])
        return (0);

    /* Paranoia */
    if (borg_simulate && (randint0(100) < 5))
        return (0);

    /* Look for an un-id'd wand */
    for (i = 0; i < z_info->pack_size; i++) {
        if (borg_items[i].tval != TV_ROD)
            continue;

        /* known */
        if (borg_items[i].kind)
            continue;

        /* No charges */
        if (!borg_items[i].pval)
            continue;

        /* Not an attacker */
        if (strstr(borg_items[i].desc, "tried"))
            continue;

        /* Select this rod */
        b_i = i;
    }

    /* None available */
    if (b_i < 0)
        return (0);

    /* Choose optimal location */
    b_n = borg_launch_bolt(0, dam, typ, z_info->max_range, 0);

    /* Simulation */
    if (borg_simulate)
        return (b_n);

    /* Log the message */
    borg_note(format("# Aiming unknown rod '%s.'", borg_items[b_i].desc));

    /* record the address to avoid certain bugs with inscriptions&amnesia */
    borg_zap_slot = b_i;

    /* Perform the action */
    borg_keypress('z');
    borg_keypress(all_letters_nohjkl[b_i]);

    /* Use target */
    borg_keypress('5');

    /* Set our shooting flag */
    successful_target = -1;

    /* Value */
    return (b_n);
}